

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall libtorrent::add_torrent_alert::~add_torrent_alert(add_torrent_alert *this)

{
  ~add_torrent_alert(this);
  operator_delete(this,0x370);
  return;
}

Assistant:

struct TORRENT_EXPORT add_torrent_alert final : torrent_alert
	{
		// internal
		add_torrent_alert(aux::stack_allocator& alloc, torrent_handle const& h
			, add_torrent_params const& p, error_code const& ec);

		TORRENT_DEFINE_ALERT_PRIO(add_torrent_alert, 67, alert_priority_critical)

		static constexpr alert_category_t static_category = alert_category::status;
		std::string message() const override;

		// a copy of the parameters used when adding the torrent, it can be used
		// to identify which invocation to ``async_add_torrent()`` caused this alert.
		add_torrent_params params;

		// set to the error, if one occurred while adding the torrent.
		error_code error;
	}